

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

void __thiscall wabt::interp::Istream::EmitInternal<unsigned_long>(Istream *this,unsigned_long val)

{
  Offset offset;
  unsigned_long val_local;
  Istream *this_local;
  
  offset = end(this);
  EmitAt<unsigned_long>(this,offset,val);
  return;
}

Assistant:

void WABT_VECTORCALL Istream::EmitInternal(T val) {
  EmitAt(end(), val);
}